

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O3

uint duckdb::ParquetDecodeUtils::VarintDecode<unsigned_int,true>(ByteBuffer *buf)

{
  byte bVar1;
  uint uVar2;
  runtime_error *this;
  uint uVar3;
  
  uVar2 = 0;
  uVar3 = 0xfffffff9;
  do {
    ByteBuffer::available(buf,1);
    bVar1 = *buf->ptr;
    buf->len = buf->len - 1;
    buf->ptr = buf->ptr + 1;
    uVar2 = (bVar1 & 0x7f) << ((char)uVar3 + 7U & 0x1f) | uVar2;
    if (-1 < (char)bVar1) {
      return uVar2;
    }
    uVar3 = uVar3 + 7;
  } while (uVar3 < 0x1a);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this,"Varint-decoding found too large number");
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static T VarintDecode(ByteBuffer &buf) {
		T result = 0;
		uint8_t shift = 0;
		while (true) {
			uint8_t byte;
			if (CHECKED) {
				byte = buf.read<uint8_t>();
			} else {
				byte = buf.unsafe_read<uint8_t>();
			}
			result |= T(byte & 127) << shift;
			if ((byte & 128) == 0) {
				break;
			}
			shift += 7;
			if (shift > sizeof(T) * 8) {
				throw std::runtime_error("Varint-decoding found too large number");
			}
		}
		return result;
	}